

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O0

bool ReadHFE(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  unsigned_short uVar2;
  ulong extraout_RAX;
  ulong uVar3;
  exception *peVar4;
  uint *puVar5;
  element_type *peVar6;
  mapped_type *pmVar7;
  size_t in_RCX;
  size_t sVar8;
  allocator<char> local_669;
  key_type local_668;
  string local_648;
  allocator<char> local_621;
  key_type local_620;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  allocator<char> local_5b9;
  key_type local_5b8;
  string local_598;
  allocator<char> local_571;
  key_type local_570;
  string local_550;
  CylHead local_530;
  undefined1 local_528 [8];
  BitBuffer bitbuf;
  int local_4b4;
  int local_4b0;
  uint local_4ac;
  uint local_4a8;
  int chunk;
  int uRead;
  uint8_t head;
  int local_494;
  int local_490;
  int uTrackDataLen;
  int uTrackDataOffset;
  uint8_t cyl;
  uint8_t *pbTrack;
  MEMORY mem;
  DataRate local_460;
  int iStack_45c;
  unsigned_short data_bitrate;
  DataRate datarate;
  int track_lut_offset;
  HFE_TRACK aTrackLUT [256];
  long local_3a;
  HFE_HEADER hh;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  hh._18_8_ = disk;
  MemFile::rewind(file,(FILE *)disk);
  if ((((extraout_RAX & 1) == 0) ||
      (uVar3 = MemFile::read(file,(int)&local_3a,(void *)0x1a,in_RCX), (uVar3 & 1) == 0)) ||
     (sVar8 = 0x4546434950435848, local_3a != 0x4546434950435848)) {
    file_local._7_1_ = false;
  }
  else {
    if (hh.header_signature[0] != '\0') {
      peVar4 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[34],unsigned_char&,char_const(&)[2]>
                (peVar4,(char (*) [34])"unsupported HFE format revision (",(uchar *)&hh,
                 (char (*) [2])0x2a8e34);
      __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
    }
    uVar2 = util::letoh<unsigned_short>(hh._10_2_);
    iStack_45c = (uint)uVar2 << 9;
    bVar1 = MemFile::seek(file,iStack_45c);
    if ((!bVar1) ||
       (uVar3 = MemFile::read(file,(int)&datarate,(void *)0x400,sVar8), (uVar3 & 1) == 0)) {
      peVar4 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],int&,char_const(&)[2]>
                (peVar4,(char (*) [28])"failed to read track LUT (@",&stack0xfffffffffffffba4,
                 (char (*) [2])0x2a8e34);
      __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
    }
    mem.pb._6_2_ = util::letoh<unsigned_short>(hh.header_signature._4_2_);
    if ((mem.pb._6_2_ < 0xf0) || (0x104 < mem.pb._6_2_)) {
      if ((mem.pb._6_2_ < 0x122) || (0x136 < mem.pb._6_2_)) {
        if ((mem.pb._6_2_ < 0x1ea) || (0x1fe < mem.pb._6_2_)) {
          if (mem.pb._6_2_ != 0xffff) {
            peVar4 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[24],unsigned_short&,char_const(&)[6]>
                      (peVar4,(char (*) [24])"unsupported data rate (",
                       (unsigned_short *)((long)&mem.pb + 6),(char (*) [6])"Kbps)");
            __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
          }
          peVar4 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[42]>
                    (peVar4,(char (*) [42])"variable bitrate images are not supported");
          __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
        }
        local_460 = _500K;
      }
      else {
        local_460 = _300K;
      }
    }
    else {
      local_460 = _250K;
    }
    Format::Validate((uint)(byte)hh.header_signature[1],(uint)(byte)hh.header_signature[2],1,0x200,0
                    );
    MEMORY::MEMORY((MEMORY *)&pbTrack,0x10000);
    _uTrackDataOffset = (uint8_t *)mem._8_8_;
    for (uTrackDataLen._3_1_ = 0; uTrackDataLen._3_1_ < (byte)hh.header_signature[1];
        uTrackDataLen._3_1_ = uTrackDataLen._3_1_ + 1) {
      uVar2 = util::letoh<unsigned_short>((short)(&datarate)[uTrackDataLen._3_1_]);
      local_490 = (uint)uVar2 << 9;
      uVar2 = util::letoh<unsigned_short>
                        (*(unsigned_short *)((long)&datarate + (ulong)uTrackDataLen._3_1_ * 4 + 2));
      local_494 = (int)(uint)uVar2 >> 1;
      if ((int)mem._vptr_MEMORY < local_494) {
        peVar4 = (exception *)__cxa_allocate_exception(0x10);
        _uRead = CylStr((uint)uTrackDataLen._3_1_);
        util::exception::exception<char_const(&)[21],int&,char_const(&)[13],char_const*>
                  (peVar4,(char (*) [21])"invalid track size (",&local_494,
                   (char (*) [13])") for track ",(char **)&uRead);
        __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
      }
      for (chunk._3_1_ = 0; chunk._3_1_ < (byte)hh.header_signature[2];
          chunk._3_1_ = chunk._3_1_ + 1) {
        if (chunk._3_1_ == 1) {
          local_490 = local_490 + 0x100;
        }
        for (local_4a8 = 0; (int)local_4a8 < local_494; local_4a8 = local_4ac + local_4a8) {
          local_4b0 = local_494 - local_4a8;
          local_4b4 = 0x100;
          puVar5 = (uint *)std::min<int>(&local_4b0,&local_4b4);
          local_4ac = *puVar5;
          sVar8 = (size_t)local_4a8;
          bVar1 = MemFile::seek(file,local_490 + local_4a8 * 2);
          if ((!bVar1) ||
             (uVar3 = MemFile::read(file,(int)_uTrackDataOffset + local_4a8,(void *)(ulong)local_4ac
                                    ,sVar8), (uVar3 & 1) == 0)) {
            peVar4 = (exception *)__cxa_allocate_exception(0x10);
            bitbuf._96_8_ = CH((uint)uTrackDataLen._3_1_,(uint)chunk._3_1_);
            util::exception::exception<char_const(&)[28],char_const*>
                      (peVar4,(char (*) [28])"EOF reading track data for ",
                       (char **)&bitbuf.m_wrapped);
            __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
          }
        }
        sVar8 = (size_t)(uint)(local_494 << 3);
        BitBuffer::BitBuffer((BitBuffer *)local_528,local_460,_uTrackDataOffset,local_494 << 3);
        peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            hh._18_8_);
        CylHead::CylHead(&local_530,(uint)uTrackDataLen._3_1_,(uint)chunk._3_1_);
        Disk::write(peVar6,(int)&local_530,local_528,sVar8);
        BitBuffer::~BitBuffer((BitBuffer *)local_528);
      }
    }
    to_string_abi_cxx11_(&local_550,(uint)hh.format_revision);
    peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        hh._18_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_570,"interface_mode",&local_571);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar6->metadata,&local_570);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_550);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator(&local_571);
    std::__cxx11::string::~string((string *)&local_550);
    to_string_abi_cxx11_(&local_598,(uint)(byte)hh.header_signature[3]);
    peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        hh._18_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b8,"track_encoding",&local_5b9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar6->metadata,&local_5b8);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_598);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator(&local_5b9);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::to_string(&local_600,(uint)(ushort)hh.header_signature._4_2_);
    std::operator+(&local_5e0,&local_600,"Kbps");
    peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        hh._18_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_620,"data_bitrate",&local_621);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar6->metadata,&local_620);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    if (hh.header_signature._6_2_ != 0) {
      std::__cxx11::to_string(&local_648,(uint)(ushort)hh.header_signature._6_2_);
      peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          hh._18_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,"floppy_rpm",&local_669);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&peVar6->metadata,&local_668);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_648);
      std::__cxx11::string::~string((string *)&local_668);
      std::allocator<char>::~allocator(&local_669);
      std::__cxx11::string::~string((string *)&local_648);
    }
    peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        hh._18_8_);
    std::__cxx11::string::operator=((string *)&peVar6->strType,"HFE");
    file_local._7_1_ = true;
    MEMORY::~MEMORY((MEMORY *)&pbTrack);
  }
  return file_local._7_1_;
}

Assistant:

bool ReadHFE(MemFile& file, std::shared_ptr<Disk>& disk)
{
    HFE_HEADER hh;
    if (!file.rewind() || !file.read(&hh, sizeof(hh)) || memcmp(&hh.header_signature, HFE_SIGNATURE, sizeof(hh.header_signature)))
        return false;

    if (hh.format_revision != 0)
        throw util::exception("unsupported HFE format revision (", hh.format_revision, ")");

    HFE_TRACK aTrackLUT[256];
    auto track_lut_offset = util::letoh(hh.track_list_offset) << 9;
    if (!file.seek(track_lut_offset) || !file.read(aTrackLUT, sizeof(aTrackLUT)))
        throw util::exception("failed to read track LUT (@", track_lut_offset, ")");

    auto datarate = DataRate::Unknown;
    auto data_bitrate = util::letoh(hh.bitrate_kbps);
    if (data_bitrate >= 240 && data_bitrate <= 260)
        datarate = DataRate::_250K;
    else if (data_bitrate >= 290 && data_bitrate <= 310)
        datarate = DataRate::_300K;
    else if (data_bitrate >= 490 && data_bitrate <= 510)
        datarate = DataRate::_500K;
    else if (data_bitrate == 0xffff)
        throw util::exception("variable bitrate images are not supported");
    else
        throw util::exception("unsupported data rate (", data_bitrate, "Kbps)");

    Format::Validate(hh.number_of_tracks, hh.number_of_sides);

    // 64K should be enough for maximum MFM track size, and we'll check later anyway
    MEMORY mem(0x10000);
    auto pbTrack = mem.pb;

    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        // Offset is in 512-byte blocks, data length covers both heads
        auto uTrackDataOffset = util::letoh(aTrackLUT[cyl].offset) << 9;
        auto uTrackDataLen = util::letoh(aTrackLUT[cyl].track_len) >> 1;

        if (uTrackDataLen > mem.size)
            throw util::exception("invalid track size (", uTrackDataLen, ") for track ", CylStr(cyl));

        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            // Head 1 data starts 256 bytes in
            if (head == 1)
                uTrackDataOffset += 256;

            auto uRead = 0;
            while (uRead < uTrackDataLen)
            {
                auto chunk = std::min(uTrackDataLen - uRead, 256);

                // Read the next interleaved chunk
                if (!file.seek(uTrackDataOffset + (uRead * 2)) || !file.read(pbTrack + uRead, chunk))
                    throw util::exception("EOF reading track data for ", CH(cyl, head));

                uRead += chunk;
            }

            BitBuffer bitbuf(datarate, pbTrack, uTrackDataLen * 8);
            disk->write(CylHead(cyl, head), std::move(bitbuf));
        }
    }

    disk->metadata["interface_mode"] = to_string(static_cast<FloppyInterfaceMode>(hh.floppy_interface_mode));
    disk->metadata["track_encoding"] = to_string(static_cast<TrackEncoding>(hh.track_encoding));
    disk->metadata["data_bitrate"] = std::to_string(hh.bitrate_kbps) + "Kbps";
    if (hh.floppy_rpm)
        disk->metadata["floppy_rpm"] = std::to_string(hh.floppy_rpm);

    disk->strType = "HFE";
    return true;
}